

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

Vec_Str_t *
Abc_SclProduceGenlibStrProfile
          (SC_Lib *p,Mio_Library_t *pLib,float Slew,float Gain,int nGatesMin,int *pnCellCount)

{
  int iVar1;
  SC_Cell *pSVar2;
  Vec_Str_t *p_00;
  Mio_Gate_t *pGate_00;
  size_t sVar3;
  char *pcVar4;
  undefined8 *puVar5;
  float fVar6;
  char *local_158;
  float Delay;
  Mio_Gate_t *pGate;
  int nClassMax;
  int Count;
  int k;
  int i;
  SC_Pin *pPin;
  SC_Cell *pRepr;
  Vec_Str_t *vStr;
  char Buffer [200];
  int *pnCellCount_local;
  int nGatesMin_local;
  float Gain_local;
  float Slew_local;
  Mio_Library_t *pLib_local;
  SC_Lib *p_local;
  
  pGate._4_4_ = 2;
  pGate._0_4_ = 0;
  Buffer._192_8_ = pnCellCount;
  for (Count = 0; iVar1 = Vec_PtrSize(&p->vCellClasses), Count < iVar1; Count = Count + 1) {
    pSVar2 = (SC_Cell *)Vec_PtrEntry(&p->vCellClasses,Count);
    if (pSVar2->n_outputs == 1) {
      iVar1 = Abc_SclClassCellNum(pSVar2);
      pGate._0_4_ = Abc_MaxInt((int)pGate,iVar1);
    }
  }
  pnCellCount_local._4_4_ = nGatesMin;
  if ((nGatesMin != 0) && ((int)pGate <= nGatesMin)) {
    pnCellCount_local._4_4_ = 0;
  }
  Abc_SclMarkSkippedCells(p);
  p_00 = Vec_StrAlloc(1000);
  Vec_StrPrintStr(p_00,"GATE _const0_            0.00 z=CONST0;\n");
  Vec_StrPrintStr(p_00,"GATE _const1_            0.00 z=CONST1;\n");
  Count = 0;
  do {
    iVar1 = Vec_PtrSize(&p->vCells);
    if (iVar1 <= Count) {
      Vec_StrPrintStr(p_00,"\n.end\n");
      Vec_StrPush(p_00,'\0');
      if (Buffer._192_8_ != 0) {
        *(int *)Buffer._192_8_ = pGate._4_4_;
      }
      return p_00;
    }
    pSVar2 = (SC_Cell *)Vec_PtrEntry(&p->vCells,Count);
    if ((((pSVar2->n_inputs != 0) && (pSVar2->n_outputs < 2)) &&
        ((pnCellCount_local._4_4_ == 0 ||
         ((pSVar2->n_inputs < 3 ||
          (iVar1 = Abc_SclClassCellNum(pSVar2), pnCellCount_local._4_4_ <= iVar1)))))) &&
       ((pSVar2->n_inputs < 2 ||
        ((pGate_00 = Mio_LibraryReadGateByName(pLib,pSVar2->pName,(char *)0x0),
         pGate_00 != (Mio_Gate_t *)0x0 && (iVar1 = Mio_GateReadProfile(pGate_00), iVar1 != 0)))))) {
      sVar3 = strlen(pSVar2->pName);
      if (199 < sVar3) {
        __assert_fail("strlen(pRepr->pName) < 200",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibUtil.c"
                      ,0x3c3,
                      "Vec_Str_t *Abc_SclProduceGenlibStrProfile(SC_Lib *, Mio_Library_t *, float, float, int, int *)"
                     );
      }
      Vec_StrPrintStr(p_00,"GATE ");
      sprintf((char *)&vStr,"%-16s",pSVar2->pName);
      Vec_StrPrintStr(p_00,(char *)&vStr);
      Vec_StrPrintStr(p_00," ");
      sprintf((char *)&vStr,"%7.2f",(double)pSVar2->area);
      Vec_StrPrintStr(p_00,(char *)&vStr);
      Vec_StrPrintStr(p_00," ");
      pcVar4 = SC_CellPinName(pSVar2,pSVar2->n_inputs);
      Vec_StrPrintStr(p_00,pcVar4);
      Vec_StrPrintStr(p_00,"=");
      pcVar4 = SC_CellPinOutFunc(pSVar2,0);
      if (pcVar4 == (char *)0x0) {
        local_158 = "?";
      }
      else {
        local_158 = SC_CellPinOutFunc(pSVar2,0);
      }
      Vec_StrPrintStr(p_00,local_158);
      Vec_StrPrintStr(p_00,";\n");
      for (nClassMax = 0; nClassMax < pSVar2->n_inputs; nClassMax = nClassMax + 1) {
        puVar5 = (undefined8 *)Vec_PtrEntry(&pSVar2->vPins,nClassMax);
        fVar6 = Abc_SclComputeDelayClassPin(p,pSVar2,nClassMax,Slew,Gain);
        if (fVar6 <= 0.0) {
          __assert_fail("Delay > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibUtil.c"
                        ,0x3d3,
                        "Vec_Str_t *Abc_SclProduceGenlibStrProfile(SC_Lib *, Mio_Library_t *, float, float, int, int *)"
                       );
        }
        Vec_StrPrintStr(p_00,"         PIN ");
        sprintf((char *)&vStr,"%-4s",*puVar5);
        Vec_StrPrintStr(p_00,(char *)&vStr);
        sprintf((char *)&vStr," UNKNOWN  1  999  %7.2f  0.00  %7.2f  0.00\n",(double)fVar6,
                (double)fVar6);
        Vec_StrPrintStr(p_00,(char *)&vStr);
      }
      pGate._4_4_ = pGate._4_4_ + 1;
    }
    Count = Count + 1;
  } while( true );
}

Assistant:

Vec_Str_t * Abc_SclProduceGenlibStrProfile( SC_Lib * p, Mio_Library_t * pLib, float Slew, float Gain, int nGatesMin, int * pnCellCount )
{
    char Buffer[200];
    Vec_Str_t * vStr;
    SC_Cell * pRepr;
    SC_Pin * pPin;
    int i, k, Count = 2, nClassMax = 0;
    // find the largest number of cells in a class
    SC_LibForEachCellClass( p, pRepr, i )
        if ( pRepr->n_outputs == 1 )
            nClassMax = Abc_MaxInt( nClassMax, Abc_SclClassCellNum(pRepr) );
    // update the number
    if ( nGatesMin && nGatesMin >= nClassMax )
        nGatesMin = 0;
    // mark skipped cells
    Abc_SclMarkSkippedCells( p );
    vStr = Vec_StrAlloc( 1000 );
    Vec_StrPrintStr( vStr, "GATE _const0_            0.00 z=CONST0;\n" );
    Vec_StrPrintStr( vStr, "GATE _const1_            0.00 z=CONST1;\n" );
    SC_LibForEachCell( p, pRepr, i )
    {
        if ( pRepr->n_inputs == 0 )
            continue;
        if ( pRepr->n_outputs > 1 )
            continue;
        if ( nGatesMin && pRepr->n_inputs > 2 && Abc_SclClassCellNum(pRepr) < nGatesMin )
            continue;
        // check if the gate is in the profile
        if ( pRepr->n_inputs > 1 )
        {
            Mio_Gate_t * pGate = Mio_LibraryReadGateByName( pLib, pRepr->pName, NULL );
            if ( pGate == NULL || Mio_GateReadProfile(pGate) == 0 )
                continue;
        }
        // process gate
        assert( strlen(pRepr->pName) < 200 );
        Vec_StrPrintStr( vStr, "GATE " );
        sprintf( Buffer, "%-16s", pRepr->pName );
        Vec_StrPrintStr( vStr, Buffer );
        Vec_StrPrintStr( vStr, " " );
//        sprintf( Buffer, "%7.2f", Abc_SclComputeAreaClass(pRepr) );
        sprintf( Buffer, "%7.2f", pRepr->area );
        Vec_StrPrintStr( vStr, Buffer );
        Vec_StrPrintStr( vStr, " " );
        Vec_StrPrintStr( vStr, SC_CellPinName(pRepr, pRepr->n_inputs) );
        Vec_StrPrintStr( vStr, "=" );
        Vec_StrPrintStr( vStr, SC_CellPinOutFunc(pRepr, 0) ? SC_CellPinOutFunc(pRepr, 0) : "?" );
        Vec_StrPrintStr( vStr, ";\n" );
        SC_CellForEachPinIn( pRepr, pPin, k )
        {
            float Delay = Abc_SclComputeDelayClassPin( p, pRepr, k, Slew, Gain );
            assert( Delay > 0 );
            Vec_StrPrintStr( vStr, "         PIN " );
            sprintf( Buffer, "%-4s", pPin->pName );
            Vec_StrPrintStr( vStr, Buffer );
            sprintf( Buffer, " UNKNOWN  1  999  %7.2f  0.00  %7.2f  0.00\n", Delay, Delay );
            Vec_StrPrintStr( vStr, Buffer );
        }
        Count++;
    }
    Vec_StrPrintStr( vStr, "\n.end\n" );
    Vec_StrPush( vStr, '\0' );
//    printf( "GENLIB library with %d gates is produced:\n", Count );
//    printf( "%s", Vec_StrArray(vStr) );
    if ( pnCellCount )
        *pnCellCount = Count;
    return vStr;
}